

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O1

void __thiscall
QPDF::optimize(QPDF *this,
              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              *object_stream_data,bool allow_changes,
              function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<int_(QPDFObjectHandle_&)>::function
            ((function<int_(QPDFObjectHandle_&)> *)&local_40,skip_stream_parameters);
  optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,object_stream_data,allow_changes,(function<int_(QPDFObjectHandle_&)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void
QPDF::optimize(
    std::map<int, int> const& object_stream_data,
    bool allow_changes,
    std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    optimize_internal(object_stream_data, allow_changes, skip_stream_parameters);
}